

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3detectionoutput_x86_avx.cpp
# Opt level: O2

int __thiscall
ncnn::Yolov3DetectionOutput_x86_avx::forward
          (Yolov3DetectionOutput_x86_avx *this,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  uint *puVar1;
  size_t sVar2;
  void *pvVar3;
  ulong uVar4;
  Mat *this_00;
  undefined1 auVar5 [12];
  undefined1 auVar6 [12];
  int iVar7;
  uint *puVar8;
  ulong uVar9;
  pointer pBVar10;
  ulong uVar11;
  long lVar12;
  float *pfVar13;
  ulong uVar14;
  float *pfVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  pointer pMVar19;
  float *pfVar20;
  int i;
  long lVar21;
  ulong uVar22;
  int iVar23;
  long lVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  undefined4 extraout_XMM0_Db;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 extraout_var [60];
  undefined1 auVar35 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [64];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 in_ZMM2 [64];
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  bbox_rects;
  float *local_138;
  float *local_130;
  vector<unsigned_long,_std::allocator<unsigned_long>_> picked;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  all_bbox_rects;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  
  all_bbox_rects.
  super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  all_bbox_rects.
  super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  all_bbox_rects.
  super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar18 = 0;
  do {
    if ((ulong)(((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                       _M_impl.super__Vector_impl_data._M_finish -
                (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_start) / 0x48) <= uVar18) {
      Yolov3DetectionOutput::qsort_descent_inplace
                (&this->super_Yolov3DetectionOutput,&all_bbox_rects);
      picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = 0.0;
      picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start._4_4_ = 0;
      picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = 0.0;
      picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      Yolov3DetectionOutput::nms_sorted_bboxes
                (&this->super_Yolov3DetectionOutput,&all_bbox_rects,&picked,
                 (this->super_Yolov3DetectionOutput).nms_threshold);
      bbox_rects.
      super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      bbox_rects.
      super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      bbox_rects.
      super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      for (uVar18 = 0;
          uVar18 < (ulong)((long)picked.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           CONCAT44(picked.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                    picked.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start._0_4_) >> 3);
          uVar18 = uVar18 + 1) {
        std::
        vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
        ::push_back(&bbox_rects,
                    all_bbox_rects.
                    super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                    ._M_impl.super__Vector_impl_data._M_start +
                    *(long *)(CONCAT44(picked.
                                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                       ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                       picked.
                                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                       ._M_impl.super__Vector_impl_data._M_start._0_4_) + uVar18 * 8
                             ));
      }
      uVar18 = ((long)bbox_rects.
                      super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)bbox_rects.
                     super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0x1c;
      iVar23 = (int)uVar18;
      if (iVar23 == 0) {
        iVar7 = 0;
      }
      else {
        this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        Mat::create(this_00,6,iVar23,4,opt->blob_allocator);
        pvVar3 = this_00->data;
        iVar7 = -100;
        if ((pvVar3 != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
          iVar7 = 0;
          uVar18 = uVar18 & 0xffffffff;
          if (iVar23 < 1) {
            uVar18 = 0;
          }
          pBVar10 = bbox_rects.
                    super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          for (uVar14 = 0; uVar18 != uVar14; uVar14 = uVar14 + 1) {
            fVar25 = pBVar10->score;
            lVar16 = (long)this_00->w * uVar14 * this_00->elemsize;
            *(float *)((long)pvVar3 + lVar16) = (float)pBVar10->label + 1.0;
            *(float *)((long)pvVar3 + lVar16 + 4) = fVar25;
            *(float *)((long)pvVar3 + lVar16 + 8) = pBVar10->xmin;
            *(float *)((long)pvVar3 + lVar16 + 0xc) = pBVar10->ymin;
            *(float *)((long)pvVar3 + lVar16 + 0x10) = pBVar10->xmax;
            *(float *)((long)pvVar3 + lVar16 + 0x14) = pBVar10->ymax;
            pBVar10 = pBVar10 + 1;
          }
        }
      }
      std::
      _Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
      ::~_Vector_base(&bbox_rects.
                       super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                     );
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
LAB_003ff90d:
      std::
      _Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
      ::~_Vector_base(&all_bbox_rects.
                       super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                     );
      return iVar7;
    }
    bbox_rects.
    super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    bbox_rects.
    super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    bbox_rects.
    super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
    ::resize((vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
              *)&bbox_rects,(long)(this->super_Yolov3DetectionOutput).num_box);
    pMVar19 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    iVar23 = (this->super_Yolov3DetectionOutput).num_box;
    iVar7 = pMVar19[uVar18].c / iVar23;
    if (iVar7 != (this->super_Yolov3DetectionOutput).num_class + 5) {
      std::
      vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
      ::~vector((vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                 *)&bbox_rects);
      iVar7 = -1;
      goto LAB_003ff90d;
    }
    pMVar19 = pMVar19 + uVar18;
    lVar16 = (long)iVar23;
    uVar14._0_4_ = pMVar19->w;
    uVar14._4_4_ = pMVar19->h;
    auVar28._8_8_ = 0;
    auVar28._0_8_ = uVar14;
    auVar28 = vcvtdq2ps_avx(auVar28);
    fVar25 = *(float *)((long)(this->super_Yolov3DetectionOutput).anchors_scale.data + uVar18 * 4);
    auVar35._0_4_ = fVar25 * auVar28._0_4_;
    auVar35._4_4_ = fVar25 * auVar28._4_4_;
    auVar35._8_4_ = fVar25 * auVar28._8_4_;
    auVar35._12_4_ = fVar25 * auVar28._12_4_;
    auVar35 = vroundps_avx(auVar35,0xb);
    uVar11 = 0;
    if (0 < (int)(undefined4)uVar14) {
      uVar11 = uVar14 & 0xffffffff;
    }
    uVar17 = uVar14 >> 0x20;
    if (uVar14._4_4_ == 0 || (long)uVar14 < 0) {
      uVar17 = 0;
    }
    auVar36._0_12_ = ZEXT412(0x3f000000) << 0x40;
    auVar36._12_4_ = 0x3f000000;
    auVar37._8_8_ = auVar36._8_8_;
    auVar37._0_8_ = auVar28._0_8_;
    auVar29._8_4_ = 0x3f800000;
    auVar29._0_8_ = 0x3f8000003f800000;
    auVar29._12_4_ = 0x3f800000;
    auVar29 = vdivps_avx(auVar29,auVar37);
    for (lVar12 = 0; lVar12 < iVar23; lVar12 = lVar12 + 1) {
      lVar21 = lVar12 * iVar7;
      sVar2 = pMVar19->cstep;
      pvVar3 = pMVar19->data;
      uVar4 = pMVar19->elemsize;
      auVar30._8_4_ = 0x3f800000;
      auVar30._0_8_ = 0x3f8000003f800000;
      auVar30._12_4_ = 0x3f800000;
      auVar36 = vmovhps_avx(auVar30,*(undefined8 *)
                                     ((long)(this->super_Yolov3DetectionOutput).biases.data +
                                     (long)((int)*(float *)((long)(this->super_Yolov3DetectionOutput
                                                                  ).mask.data +
                                                           lVar12 * 4 + lVar16 * uVar18 * 4) * 2) *
                                     4));
      local_130 = (float *)(sVar2 * lVar21 * uVar4 + (long)pvVar3);
      local_138 = (float *)((lVar21 + 1) * sVar2 * uVar4 + (long)pvVar3);
      pfVar15 = (float *)((lVar21 + 2) * sVar2 * uVar4 + (long)pvVar3);
      pfVar13 = (float *)((lVar21 + 3) * sVar2 * uVar4 + (long)pvVar3);
      pfVar20 = (float *)((lVar21 + 4) * sVar2 * uVar4 + (long)pvVar3);
      lVar24 = (long)(int)(((long)pMVar19->d * uVar4 * (long)pMVar19->h * (long)pMVar19->w + 0xf &
                           0xfffffffffffffff0) / uVar4);
      for (uVar9 = 0; uVar9 != uVar17; uVar9 = uVar9 + 1) {
        auVar31._0_4_ = (float)(int)uVar9;
        auVar31._4_12_ = in_ZMM2._4_12_;
        auVar37 = vshufps_avx(auVar31,auVar35,0x40);
        for (uVar22 = 0; uVar22 != uVar11; uVar22 = uVar22 + 1) {
          puVar8 = (uint *)((long)pvVar3 +
                           uVar22 * 4 +
                           uVar9 * (long)(int)(undefined4)uVar14 * 4 + (lVar21 + 5) * sVar2 * uVar4)
          ;
          puVar1 = puVar8 + (this->super_Yolov3DetectionOutput).num_class * lVar24;
          auVar41 = ZEXT464(0xff7fffff);
          while( true ) {
            if (puVar1 <= puVar8) break;
            auVar30 = vmaxss_avx(ZEXT416(*puVar8),auVar41._0_16_);
            auVar41 = ZEXT1664(auVar30);
            puVar8 = puVar8 + lVar24;
          }
          fVar25 = expf(-*pfVar20);
          fVar26 = expf(-auVar41._0_4_);
          fVar25 = 1.0 / ((fVar26 + 1.0) * fVar25 + 1.0);
          if ((this->super_Yolov3DetectionOutput).confidence_threshold <= fVar25) {
            fVar26 = expf(-*local_130);
            fVar27 = expf(-*local_138);
            auVar30 = vinsertps_avx(ZEXT416((uint)(fVar26 + 1.0)),ZEXT416((uint)(fVar27 + 1.0)),0x10
                                   );
            fVar26 = expf(*pfVar15);
            auVar41._0_4_ = expf(*pfVar13);
            auVar41._4_60_ = extraout_var;
            auVar38._8_8_ = CONCAT44(extraout_XMM0_Db,fVar26);
            auVar38._0_8_ = CONCAT44(extraout_XMM0_Db,fVar26);
            auVar31 = vinsertps_avx(auVar38,auVar41._0_16_,0x30);
            auVar30 = vdivps_avx(auVar36,auVar30);
            auVar42._0_4_ = (float)(int)uVar22;
            auVar42._4_12_ = auVar37._4_12_;
            auVar5._4_8_ = auVar31._8_8_;
            auVar5._0_4_ = auVar36._4_4_ * auVar31._4_4_;
            auVar32._0_8_ = auVar5._0_8_ << 0x20;
            auVar32._8_4_ = auVar36._8_4_ * auVar31._8_4_;
            auVar32._12_4_ = auVar36._12_4_ * auVar31._12_4_;
            auVar33._8_8_ = auVar32._8_8_;
            auVar33._0_8_ = auVar30._0_8_;
            local_88 = auVar29._0_4_;
            fStack_84 = auVar29._4_4_;
            fStack_80 = auVar29._8_4_;
            fStack_7c = auVar29._12_4_;
            auVar39._0_4_ = (auVar30._0_4_ + auVar42._0_4_) * local_88;
            auVar39._4_4_ = (auVar30._4_4_ + auVar37._4_4_) * fStack_84;
            auVar39._8_4_ = (auVar30._8_4_ + auVar37._8_4_) * fStack_80;
            auVar39._12_4_ = (auVar30._12_4_ + auVar37._12_4_) * fStack_7c;
            auVar30 = vdivps_avx(auVar33,auVar42);
            auVar43._0_4_ = auVar30._0_4_ * auVar28._0_4_;
            auVar43._4_4_ = auVar30._4_4_ * auVar28._4_4_;
            auVar43._8_4_ = auVar30._8_4_ * 0.5;
            auVar43._12_4_ = auVar30._12_4_ * 0.5;
            auVar31 = vshufpd_avx(auVar43,auVar39,1);
            auVar32 = vsubps_avx(auVar39,auVar31);
            auVar6._4_8_ = auVar43._8_8_;
            auVar6._0_4_ = auVar43._4_4_ + auVar31._4_4_;
            auVar44._0_8_ = auVar6._0_8_ << 0x20;
            auVar44._8_4_ = auVar43._8_4_ + auVar31._8_4_;
            auVar44._12_4_ = auVar43._12_4_ + auVar31._12_4_;
            auVar40._0_8_ = auVar32._0_8_;
            auVar40._8_8_ = auVar44._8_8_;
            auVar31 = vmovshdup_avx(auVar30);
            in_ZMM2 = ZEXT1664(auVar31);
            auVar34._0_4_ = auVar31._0_4_ * auVar30._0_4_;
            auVar34._4_4_ = auVar31._4_4_ * auVar30._4_4_;
            auVar34._8_4_ = auVar31._8_4_ * auVar30._8_4_;
            auVar34._12_4_ = auVar31._12_4_ * auVar30._12_4_;
            picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start._4_4_ = auVar32._0_4_;
            picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish = auVar40._4_8_;
            picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_ = vextractps_avx(auVar34,2);
            picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start._0_4_ = fVar25;
            picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._0_4_ = auVar44._12_4_;
            std::
            vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
            ::push_back((vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                         *)(&(bbox_rects.
                              super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                              ._M_impl.super__Vector_impl_data._M_start)->score + lVar12 * 6),
                        (value_type *)&picked);
          }
          local_130 = local_130 + 1;
          local_138 = local_138 + 1;
          pfVar15 = pfVar15 + 1;
          pfVar13 = pfVar13 + 1;
          pfVar20 = pfVar20 + 1;
        }
      }
      iVar23 = (this->super_Yolov3DetectionOutput).num_box;
    }
    lVar16 = 8;
    for (lVar12 = 0; lVar12 < iVar23; lVar12 = lVar12 + 1) {
      std::
      vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
      ::
      insert<__gnu_cxx::__normal_iterator<ncnn::Yolov3DetectionOutput::BBoxRect_const*,std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>>,void>
                ((vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
                  *)&all_bbox_rects,
                 (const_iterator)
                 all_bbox_rects.
                 super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
                 *(BBoxRect **)
                  ((long)bbox_rects.
                         super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar16 + -8),
                 *(BBoxRect **)
                  ((long)&(bbox_rects.
                           super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                           ._M_impl.super__Vector_impl_data._M_start)->score + lVar16));
      iVar23 = (this->super_Yolov3DetectionOutput).num_box;
      lVar16 = lVar16 + 0x18;
    }
    std::
    vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
    ::~vector((vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
               *)&bbox_rects);
    uVar18 = uVar18 + 1;
  } while( true );
}

Assistant:

int Yolov3DetectionOutput_x86_avx::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    // gather all box
    std::vector<BBoxRect> all_bbox_rects;

    for (size_t b = 0; b < bottom_blobs.size(); b++)
    {
        std::vector<std::vector<BBoxRect> > all_box_bbox_rects;
        all_box_bbox_rects.resize(num_box);
        const Mat& bottom_top_blobs = bottom_blobs[b];

        int w = bottom_top_blobs.w;
        int h = bottom_top_blobs.h;
        int channels = bottom_top_blobs.c;
        //printf("%d %d %d\n", w, h, channels);
        const int channels_per_box = channels / num_box;

        // anchor coord + box score + num_class
        if (channels_per_box != 4 + 1 + num_class)
            return -1;
        size_t mask_offset = b * num_box;
        int net_w = (int)(anchors_scale[b] * w);
        int net_h = (int)(anchors_scale[b] * h);
//printf("%d %d\n", net_w, net_h);

//printf("%d %d %d\n", w, h, channels);
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp = 0; pp < num_box; pp++)
        {
            int p = pp * channels_per_box;
            int biases_index = static_cast<int>(mask[pp + mask_offset]);
            //printf("%d\n", biases_index);
            const float bias_w = biases[biases_index * 2];
            const float bias_h = biases[biases_index * 2 + 1];
            //printf("%f %f\n", bias_w, bias_h);
            const float* xptr = bottom_top_blobs.channel(p);
            const float* yptr = bottom_top_blobs.channel(p + 1);
            const float* wptr = bottom_top_blobs.channel(p + 2);
            const float* hptr = bottom_top_blobs.channel(p + 3);

            const float* box_score_ptr = bottom_top_blobs.channel(p + 4);

            // softmax class scores
            Mat scores = bottom_top_blobs.channel_range(p + 5, num_class);
            //softmax->forward_inplace(scores, opt);

            const int cs = (int)scores.cstep;

#if __AVX2__
            const __m256i vi = _mm256_setr_epi32(
                                   0, cs * 1, cs * 2, cs * 3, cs * 4, cs * 5, cs * 6, cs * 7);
#endif

            for (int i = 0; i < h; i++)
            {
                for (int j = 0; j < w; j++)
                {
#if 0
                    int class_index = 0;
                    float class_score = -FLT_MAX;
                    for (int q = 0; q < num_class; q++)
                    {
                        float score = scores.channel(q).row(i)[j];
                        if (score > class_score)
                        {
                            class_index = q;
                            class_score = score;
                        }
                    }
#else
                    // find class index with max class score
                    int class_index = 0;
                    float class_score = -FLT_MAX;
                    float* ptr = ((float*)scores.data) + i * w + j;
                    float* end = ptr + num_class * cs;
                    int q = 0;
#if __AVX2__
                    float* end8 = ptr + (num_class & -8) * cs;
                    unsigned long index;

                    for (; ptr < end8; ptr += 8 * cs, q += 8)
                    {
                        __m256 p = _mm256_i32gather_ps(ptr, vi, 4);
                        __m256 t = _mm256_max_ps(p, _mm256_permute2f128_ps(p, p, 1));
                        t = _mm256_max_ps(t, _mm256_permute_ps(t, 0x4e));
                        t = _mm256_max_ps(t, _mm256_permute_ps(t, 0xb1));
                        float score = _mm_cvtss_f32(_mm256_extractf128_ps(t, 0));

                        if (score > class_score)
                        {
                            __m256 mi = _mm256_cmp_ps(p, t, _CMP_EQ_OQ);
                            int mask = _mm256_movemask_ps(mi);
#ifdef _MSC_VER
                            BitScanForward(&index, mask);
#else
                            index = __builtin_ctz(mask);
#endif
                            class_index = q + index;
                            class_score = score;
                        }
                    }
#endif

                    for (; ptr < end; ptr += cs, q++)
                    {
                        if (*ptr > class_score)
                        {
                            class_index = q;
                            class_score = *ptr;
                        }
                    }
#endif
                    //sigmoid(box_score) * sigmoid(class_score)
                    float confidence = 1.f / ((1.f + expf(-box_score_ptr[0]) * (1.f + expf(-class_score))));
                    if (confidence >= confidence_threshold)
                    {
                        // region box
                        float bbox_cx = (j + sigmoid(xptr[0])) / w;
                        float bbox_cy = (i + sigmoid(yptr[0])) / h;
                        float bbox_w = expf(wptr[0]) * bias_w / net_w;
                        float bbox_h = expf(hptr[0]) * bias_h / net_h;

                        float bbox_xmin = bbox_cx - bbox_w * 0.5f;
                        float bbox_ymin = bbox_cy - bbox_h * 0.5f;
                        float bbox_xmax = bbox_cx + bbox_w * 0.5f;
                        float bbox_ymax = bbox_cy + bbox_h * 0.5f;

                        float area = bbox_w * bbox_h;

                        BBoxRect c = {confidence, bbox_xmin, bbox_ymin, bbox_xmax, bbox_ymax, area, class_index};
                        all_box_bbox_rects[pp].push_back(c);
                    }

                    xptr++;
                    yptr++;
                    wptr++;
                    hptr++;

                    box_score_ptr++;
                }
            }
        }

        for (int i = 0; i < num_box; i++)
        {
            const std::vector<BBoxRect>& box_bbox_rects = all_box_bbox_rects[i];

            all_bbox_rects.insert(all_bbox_rects.end(), box_bbox_rects.begin(), box_bbox_rects.end());
        }
    }

    // global sort inplace
    qsort_descent_inplace(all_bbox_rects);

    // apply nms
    std::vector<size_t> picked;
    nms_sorted_bboxes(all_bbox_rects, picked, nms_threshold);

    // select
    std::vector<BBoxRect> bbox_rects;

    for (size_t i = 0; i < picked.size(); i++)
    {
        size_t z = picked[i];
        bbox_rects.push_back(all_bbox_rects[z]);
    }

    // fill result
    int num_detected = static_cast<int>(bbox_rects.size());
    if (num_detected == 0)
        return 0;

    Mat& top_blob = top_blobs[0];
    top_blob.create(6, num_detected, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    for (int i = 0; i < num_detected; i++)
    {
        const BBoxRect& r = bbox_rects[i];
        float score = r.score;
        float* outptr = top_blob.row(i);

        outptr[0] = r.label + 1.0f; // +1 for prepend background class
        outptr[1] = score;
        outptr[2] = r.xmin;
        outptr[3] = r.ymin;
        outptr[4] = r.xmax;
        outptr[5] = r.ymax;
    }

    return 0;
}